

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<capnp::EzRpcClient::Impl::ClientContext>::disposeImpl
          (HeapDisposer<capnp::EzRpcClient::Impl::ClientContext> *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    capnp::_::RpcSystemBase::~RpcSystemBase((RpcSystemBase *)((long)pointer + 400));
    capnp::TwoPartyVatNetwork::~TwoPartyVatNetwork((TwoPartyVatNetwork *)((long)pointer + 0x10));
    plVar1 = *(long **)((long)pointer + 8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 8) = 0;
      (**(code **)**pointer)(*pointer,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    operator_delete(pointer,0x1a0);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }